

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O3

int SetRollPitchMisalignmentPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,double roll,double pitch)

{
  FILE *pFVar1;
  uint uVar2;
  size_t sVar3;
  ssize_t sVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char buf [32];
  char local_48 [32];
  double local_28;
  
  local_28 = pitch;
  sprintf(local_48,"#EI%+06d\r",(ulong)(uint)(int)(roll * 100.0));
  sVar3 = strlen(local_48);
  iVar5 = (pPathfinderDVL->RS232Port).DevType;
  uVar2 = (uint)sVar3;
  if (iVar5 - 1U < 4) {
    if (0 < (int)uVar2) {
      iVar5 = (pPathfinderDVL->RS232Port).s;
      uVar7 = 0;
      do {
        sVar4 = send(iVar5,local_48 + uVar7,(long)(int)(uVar2 - (int)uVar7),0);
        if ((int)sVar4 < 1) goto LAB_001b0380;
        uVar6 = (int)uVar7 + (int)sVar4;
        uVar7 = (ulong)uVar6;
      } while ((int)uVar6 < (int)uVar2);
    }
LAB_001b025f:
    if ((pPathfinderDVL->bSaveRawData != 0) &&
       (pFVar1 = (FILE *)pPathfinderDVL->pfSaveFile, pFVar1 != (FILE *)0x0)) {
      sVar3 = strlen(local_48);
      fwrite(local_48,sVar3,1,pFVar1);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    sprintf(local_48,"#EJ%+06d\r",(ulong)(uint)(int)(local_28 * 100.0));
    sVar3 = strlen(local_48);
    iVar5 = (pPathfinderDVL->RS232Port).DevType;
    uVar2 = (uint)sVar3;
    if (iVar5 - 1U < 4) {
      if (0 < (int)uVar2) {
        iVar5 = (pPathfinderDVL->RS232Port).s;
        uVar7 = 0;
        do {
          sVar4 = send(iVar5,local_48 + uVar7,(long)(int)(uVar2 - (int)uVar7),0);
          if ((int)sVar4 < 1) goto LAB_001b0380;
          uVar6 = (int)uVar7 + (int)sVar4;
          uVar7 = (ulong)uVar6;
        } while ((int)uVar6 < (int)uVar2);
      }
    }
    else {
      if (iVar5 != 0) goto LAB_001b0380;
      if (uVar2 != 0) {
        iVar5 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar4 = write(iVar5,local_48 + uVar7,(ulong)(uVar2 - (int)uVar7));
          if ((int)sVar4 < 1) goto LAB_001b0380;
          uVar6 = (int)uVar7 + (int)sVar4;
          uVar7 = (ulong)uVar6;
        } while (uVar6 < uVar2);
      }
    }
    iVar5 = 0;
    if ((pPathfinderDVL->bSaveRawData != 0) &&
       (pFVar1 = (FILE *)pPathfinderDVL->pfSaveFile, iVar5 = 0, pFVar1 != (FILE *)0x0)) {
      sVar3 = strlen(local_48);
      fwrite(local_48,sVar3,1,pFVar1);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
  }
  else {
    if (iVar5 == 0) {
      if (uVar2 != 0) {
        iVar5 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar4 = write(iVar5,local_48 + uVar7,(ulong)(uVar2 - (int)uVar7));
          if ((int)sVar4 < 1) goto LAB_001b0380;
          uVar6 = (int)uVar7 + (int)sVar4;
          uVar7 = (ulong)uVar6;
        } while (uVar6 < uVar2);
      }
      goto LAB_001b025f;
    }
LAB_001b0380:
    puts("Error writing data to a PathfinderDVL. ");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

inline int SetRollPitchMisalignmentPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, double roll, double pitch)
{
	char buf[MAX_NB_BYTES_COMMAND_PATHFINDERDVL];
	
	sprintf(buf, "#EI%+06d\r", (int)(100*roll));

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}
	
	sprintf(buf, "#EJ%+06d\r", (int)(100*pitch));

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}

	return EXIT_SUCCESS;
}